

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.hpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPointsgl_PointSize::_test_descriptor::_test_descriptor
          (_test_descriptor *this)

{
  _test_descriptor *this_local;
  
  this->fs_body = (char *)0x0;
  this->gs_body = (char *)0x0;
  this->tes_body = (char *)0x0;
  this->tcs_body = (char *)0x0;
  this->vs_body = (char *)0x0;
  this->fs_id = 0;
  this->gs_id = 0;
  this->tes_id = 0;
  this->tcs_id = 0;
  this->vs_id = 0;
  this->draw_call_count = 0;
  this->po_id = 0;
  return;
}

Assistant:

_test_descriptor()
		{
			fs_body  = NULL;
			gs_body  = NULL;
			tes_body = NULL;
			tcs_body = NULL;
			vs_body  = NULL;

			fs_id  = 0;
			gs_id  = 0;
			tes_id = 0;
			tcs_id = 0;
			vs_id  = 0;

			draw_call_count = 0;
			po_id			= 0;
		}